

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::read_content<httplib::Response>(Stream *strm,Response *x,Progress *progress)

{
  Progress *pPVar1;
  Response *strm_00;
  int iVar2;
  size_t len_00;
  char *local_70;
  char **local_68;
  char **encoding;
  function<void_(unsigned_long,_unsigned_long)> local_50;
  int local_2c;
  Progress *pPStack_28;
  int len;
  Progress *progress_local;
  Response *x_local;
  Stream *strm_local;
  
  pPStack_28 = progress;
  progress_local = (Progress *)x;
  x_local = (Response *)strm;
  local_2c = get_header_value_int(&x->headers,"Content-Length",0);
  strm_00 = x_local;
  if (local_2c == 0) {
    local_70 = get_header_value((Headers *)
                                ((long)&progress_local[1].super__Function_base._M_functor + 8),
                                "Transfer-Encoding","");
    local_68 = &local_70;
    iVar2 = strcasecmp(local_70,"chunked");
    if (iVar2 == 0) {
      strm_local._7_1_ =
           read_content_chunked((Stream *)x_local,(string *)&progress_local[2]._M_invoker);
    }
    else {
      strm_local._7_1_ =
           read_content_without_length((Stream *)x_local,(string *)&progress_local[2]._M_invoker);
    }
  }
  else {
    pPVar1 = progress_local + 2;
    len_00 = (size_t)local_2c;
    std::function<void_(unsigned_long,_unsigned_long)>::function(&local_50,progress);
    strm_local._7_1_ =
         read_content_with_length((Stream *)strm_00,(string *)&pPVar1->_M_invoker,len_00,&local_50);
    std::function<void_(unsigned_long,_unsigned_long)>::~function(&local_50);
  }
  return (bool)(strm_local._7_1_ & 1);
}

Assistant:

bool read_content(Stream& strm, T& x, Progress progress = Progress())
{
    auto len = get_header_value_int(x.headers, "Content-Length", 0);

    if (len) {
        return read_content_with_length(strm, x.body, len, progress);
    } else {
        const auto& encoding = get_header_value(x.headers, "Transfer-Encoding", "");

        if (!strcasecmp(encoding, "chunked")) {
            return read_content_chunked(strm, x.body);
        } else {
            return read_content_without_length(strm, x.body);
        }
    }

    return true;
}